

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_hash.cpp
# Opt level: O0

void duckdb::TightLoopHash<true,duckdb::string_t>
               (string_t *ldata,hash_t *result_data,SelectionVector *rsel,idx_t count,
               SelectionVector *sel_vector,ValidityMask *mask)

{
  string_t val;
  string_t input;
  bool bVar1;
  idx_t iVar2;
  hash_t hVar3;
  idx_t iVar4;
  ulong in_RCX;
  SelectionVector *in_RDX;
  long in_RSI;
  SelectionVector *in_R8;
  TemplatedValidityMask<unsigned_long> *in_R9;
  idx_t idx_1;
  idx_t ridx_1;
  idx_t i_1;
  idx_t idx;
  idx_t ridx;
  idx_t i;
  idx_t in_stack_ffffffffffffff80;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff97;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  ulong idx_00;
  undefined8 local_38;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_R9);
  if (bVar1) {
    for (idx_00 = 0; idx_00 < in_RCX; idx_00 = idx_00 + 1) {
      iVar2 = SelectionVector::get_index(in_RDX,idx_00);
      iVar4 = SelectionVector::get_index(in_R8,iVar2);
      val.value.pointer.ptr = (char *)iVar2;
      val.value._0_8_ = iVar4;
      hVar3 = Hash<duckdb::string_t>(val);
      *(hash_t *)(in_RSI + iVar2 * 8) = hVar3;
    }
  }
  else {
    for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
      iVar2 = SelectionVector::get_index(in_RDX,local_38);
      SelectionVector::get_index(in_R8,iVar2);
      TemplatedValidityMask<unsigned_long>::RowIsValid
                (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      input.value.pointer.ptr = (char *)in_stack_ffffffffffffffa0;
      input.value._0_8_ = in_stack_ffffffffffffff98;
      hVar3 = HashOp::Operation<duckdb::string_t>(input,(bool)in_stack_ffffffffffffff97);
      *(hash_t *)(in_RSI + iVar2 * 8) = hVar3;
    }
  }
  return;
}

Assistant:

static inline void TightLoopHash(const T *__restrict ldata, hash_t *__restrict result_data, const SelectionVector *rsel,
                                 idx_t count, const SelectionVector *__restrict sel_vector, ValidityMask &mask) {
	if (!mask.AllValid()) {
		for (idx_t i = 0; i < count; i++) {
			auto ridx = HAS_RSEL ? rsel->get_index(i) : i;
			auto idx = sel_vector->get_index(ridx);
			result_data[ridx] = HashOp::Operation(ldata[idx], !mask.RowIsValid(idx));
		}
	} else {
		for (idx_t i = 0; i < count; i++) {
			auto ridx = HAS_RSEL ? rsel->get_index(i) : i;
			auto idx = sel_vector->get_index(ridx);
			result_data[ridx] = duckdb::Hash<T>(ldata[idx]);
		}
	}
}